

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_put.c
# Opt level: O2

int allwrite(_func_int_varargs *op,int fd,char *buf,uint len)

{
  int iVar1;
  int *piVar2;
  
  while( true ) {
    if (len == 0) {
      return 0;
    }
    while (iVar1 = (*op)((ulong)(uint)fd,buf,(ulong)len), iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != error_intr) {
        return -1;
      }
    }
    if (iVar1 == 0) break;
    buf = buf + iVar1;
    len = len - iVar1;
  }
  return -1;
}

Assistant:

static int allwrite(int (*op)(),int fd,const char *buf,unsigned int len)
{
  int w;

  while (len) {
    w = op(fd,buf,len);
    if (w == -1) {
      if (errno == error_intr) continue;
      return -1; /* note that some data may have been written */
    }
//TODO: probably meant as a return -1??? a break????    
	if (w == 0) 
		return -1; /* luser's fault */
    buf += w;
    len -= w;
  }
  return 0;
}